

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::advance(QGraphicsScene *this)

{
  long *plVar1;
  long lVar2;
  QList<QGraphicsItem_*> *__range2;
  long lVar3;
  long lVar4;
  int i;
  int iVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x60))
              (&local_58,*(long **)(*(long *)(this + 8) + 0x88),1);
    lVar2 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    lVar4 = local_58.size << 3;
    for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 8) {
      plVar1 = *(long **)(lVar2 + lVar3);
      (**(code **)(*plVar1 + 0x10))(plVar1,iVar5);
    }
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::advance()
{
    for (int i = 0; i < 2; ++i) {
        const auto items_ = items();
        for (QGraphicsItem *item : items_)
            item->advance(i);
    }
}